

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::NodeLoader::begin__bind_vertex_input
          (NodeLoader *this,bind_vertex_input__AttributeData *attributeData)

{
  FilePartLoader *this_00;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  TextureCoordinateBinding texCoordinateBinding;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  TextureCoordinateBinding *in_stack_fffffffffffffef0;
  value_type *__x;
  allocator<char> *__a;
  TextureCoordinateBinding *this_01;
  undefined1 local_b1 [33];
  TextureMapId local_90;
  allocator<char> local_81;
  string local_80 [48];
  size_t local_50;
  TextureCoordinateBinding local_48;
  long local_10;
  
  if ((*(long *)(in_RDI + 3) != 0) || (in_RDI[3]._M_string_length != 0)) {
    this_01 = &local_48;
    local_10 = in_RSI;
    COLLADAFW::TextureCoordinateBinding::TextureCoordinateBinding
              ((TextureCoordinateBinding *)0xc4350d);
    local_50 = *(size_t *)(local_10 + 0x18);
    COLLADAFW::TextureCoordinateBinding::setSetIndex(this_01,&local_50);
    __a = &local_81;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)this_01,__a);
    COLLADAFW::TextureCoordinateBinding::setSemantic
              (in_stack_fffffffffffffef0,
               (String *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    this_00 = HelperLoaderBase::getHandlingFilePartLoader((HelperLoaderBase *)in_RDI);
    __x = (value_type *)local_b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)this_01,__a);
    local_90 = IFilePartLoader::getTextureMapIdBySematic
                         ((IFilePartLoader *)in_stack_fffffffffffffef0,
                          (String *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    COLLADAFW::TextureCoordinateBinding::setTextureMapId(&local_48,&local_90);
    std::__cxx11::string::~string((string *)(local_b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_b1);
    std::
    set<COLLADAFW::TextureCoordinateBinding,_std::less<COLLADAFW::TextureCoordinateBinding>,_std::allocator<COLLADAFW::TextureCoordinateBinding>_>
    ::insert((set<COLLADAFW::TextureCoordinateBinding,_std::less<COLLADAFW::TextureCoordinateBinding>,_std::allocator<COLLADAFW::TextureCoordinateBinding>_>
              *)this_00,__x);
    COLLADAFW::TextureCoordinateBinding::~TextureCoordinateBinding
              ((TextureCoordinateBinding *)0xc4367a);
  }
  return true;
}

Assistant:

bool NodeLoader::begin__bind_vertex_input( const bind_vertex_input__AttributeData& attributeData )
	{
        if ( mCurrentInstanceGeometry || mCurrentInstanceController )
        {
            COLLADAFW::TextureCoordinateBinding texCoordinateBinding;
            texCoordinateBinding.setSetIndex ( (size_t)attributeData.input_set );
            texCoordinateBinding.setSemantic( attributeData.semantic );
            texCoordinateBinding.setTextureMapId ( getHandlingFilePartLoader()->getTextureMapIdBySematic( attributeData.semantic ) );
            mCurrentTextureCoordinateBindings.insert(texCoordinateBinding);
        }
		return true;
	}